

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O0

int __thiscall ncnn::ReLU::forward_inplace_int8(ReLU *this,Mat *bottom_top_blob,Option *opt)

{
  long in_RSI;
  long in_RDI;
  int i;
  char *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Mat local_78;
  char *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x34);
  local_28 = local_1c * local_20;
  if ((*(float *)(in_RDI + 0x80) == 0.0) && (!NAN(*(float *)(in_RDI + 0x80)))) {
    for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
      Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      in_stack_ffffffffffffff70 = Mat::operator_cast_to_signed_char_(&local_78);
      Mat::~Mat((Mat *)0x17c175);
      for (in_stack_ffffffffffffff78 = 0; in_stack_ffffffffffffff78 < local_28;
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 + 1) {
        if (in_stack_ffffffffffffff70[in_stack_ffffffffffffff78] < '\0') {
          in_stack_ffffffffffffff70[in_stack_ffffffffffffff78] = '\0';
        }
      }
      local_38 = in_stack_ffffffffffffff70;
    }
  }
  return 0;
}

Assistant:

int ReLU::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        // TODO
        // #pragma omp parallel for num_threads(opt.num_threads)
        // for (int q=0; q<channels; q++)
        // {
        //     float* ptr = bottom_top_blob.channel(q);

        //     for (int i=0; i<size; i++)
        //     {
        //         if (ptr[i] < 0)
        //             ptr[i] *= slope;
        //     }
        // }
    }

    return 0;
}